

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::lookingAtEndOfLine(SelectionCompiler *this)

{
  int iVar1;
  char *pcVar2;
  long in_RDI;
  char ch;
  int ichT;
  int local_14;
  
  if (*(int *)(in_RDI + 0xd8) != *(int *)(in_RDI + 0xd0)) {
    iVar1 = *(int *)(in_RDI + 0xd8);
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
    if (*pcVar2 == '\r') {
      local_14 = iVar1 + 1;
      if ((local_14 < *(int *)(in_RDI + 0xd0)) &&
         (pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20), *pcVar2 == '\n')) {
        local_14 = iVar1 + 2;
      }
    }
    else {
      if (*pcVar2 != '\n') {
        return false;
      }
      local_14 = iVar1 + 1;
    }
    *(int *)(in_RDI + 0xdc) = local_14 - *(int *)(in_RDI + 0xd8);
  }
  return true;
}

Assistant:

bool SelectionCompiler::lookingAtEndOfLine() {
    if (ichToken == cchScript) return true;
    int ichT = ichToken;
    char ch  = script[ichT];
    if (ch == '\r') {
      ++ichT;
      if (ichT < cchScript && script[ichT] == '\n') ++ichT;
    } else if (ch == '\n') {
      ++ichT;
    } else {
      return false;
    }
    cchToken = ichT - ichToken;
    return true;
  }